

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplerate.c
# Opt level: O2

SRC_STATE * src_clone(SRC_STATE *orig,int *error)

{
  int iVar1;
  SRC_STATE *pSVar2;
  
  if (orig == (SRC_STATE *)0x0) {
    if (error == (int *)0x0) {
      return (SRC_STATE *)0x0;
    }
    iVar1 = 2;
  }
  else {
    if (error != (int *)0x0) {
      *error = 0;
    }
    pSVar2 = (*orig->vt->copy)(orig);
    if (pSVar2 != (SRC_STATE *)0x0 || error == (int *)0x0) {
      return pSVar2;
    }
    iVar1 = 1;
  }
  *error = iVar1;
  return (SRC_STATE *)0x0;
}

Assistant:

SRC_STATE*
src_clone (SRC_STATE* orig, int *error)
{
	if (!orig)
	{
		if (error)
			*error = SRC_ERR_BAD_STATE ;
		return NULL ;
	}
	if (error)
		*error = SRC_ERR_NO_ERROR ;

	SRC_STATE *state = orig->vt->copy (orig) ;
	if (!state)
		if (error)
			*error = SRC_ERR_MALLOC_FAILED ;

	return state ;
}